

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost_inc.h
# Opt level: O0

double BrotliPopulationCostDistance(HistogramDistance *histogram)

{
  long lVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [16];
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  ulong local_1e0;
  size_t k;
  ulong uStack_1d0;
  uint32_t reps;
  size_t depth;
  double log2p;
  double log2total;
  uint32_t depth_histo [18];
  ulong local_168;
  size_t max_depth;
  ulong uStack_158;
  uint32_t __brotli_swap_tmp;
  size_t j;
  uint32_t histomax_1;
  uint32_t h23;
  uint32_t histo [4];
  uint32_t histomax;
  uint32_t histo2;
  uint32_t histo1;
  uint32_t histo0;
  size_t i;
  double bits;
  size_t s [5];
  int local_e4;
  int count;
  size_t data_size;
  HistogramDistance *histogram_local;
  double local_a8;
  double local_98;
  uint32_t *local_90;
  double retval;
  size_t sum;
  double *local_78;
  ulong local_70;
  size_t p;
  uint32_t *population_end;
  double retval_1;
  size_t sum_1;
  undefined8 local_48;
  double *local_40;
  double local_38;
  double local_30;
  ulong local_28;
  double local_20;
  ulong local_18;
  double local_10;
  undefined4 uVar21;
  undefined4 uVar22;
  
  local_e4 = 0;
  i = 0;
  if (histogram->total_count_ == 0) {
    histogram_local = (HistogramDistance *)0x4028000000000000;
  }
  else {
    for (_histo1 = 0; _histo1 < 0x220; _histo1 = _histo1 + 1) {
      if (histogram->data_[_histo1] != 0) {
        s[(long)local_e4 + -1] = _histo1;
        local_e4 = local_e4 + 1;
        if (4 < local_e4) break;
      }
    }
    if (local_e4 == 1) {
      histogram_local = (HistogramDistance *)0x4028000000000000;
    }
    else if (local_e4 == 2) {
      sVar2 = histogram->total_count_;
      auVar23._8_4_ = (int)(sVar2 >> 0x20);
      auVar23._0_8_ = sVar2;
      auVar23._12_4_ = 0x45300000;
      histogram_local =
           (HistogramDistance *)
           ((auVar23._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) + 20.0);
    }
    else if (local_e4 == 3) {
      uVar6 = histogram->data_[(long)bits];
      uVar3 = histogram->data_[s[0]];
      uVar4 = histogram->data_[s[1]];
      local_1e8 = uVar4;
      if (uVar4 < uVar3) {
        local_1e8 = uVar3;
      }
      local_1ec = uVar6;
      if (uVar6 <= local_1e8) {
        local_1ec = local_1e8;
      }
      histogram_local =
           (HistogramDistance *)(((double)((uVar6 + uVar3 + uVar4) * 2) + 28.0) - (double)local_1ec)
      ;
    }
    else if (local_e4 == 4) {
      for (_histo1 = 0; _histo1 < 4; _histo1 = _histo1 + 1) {
        (&histomax_1)[_histo1] = histogram->data_[s[_histo1 - 1]];
      }
      for (_histo1 = 0; uStack_158 = _histo1, _histo1 < 4; _histo1 = _histo1 + 1) {
        while (uStack_158 = uStack_158 + 1, uStack_158 < 4) {
          if ((&histomax_1)[_histo1] < (&histomax_1)[uStack_158]) {
            uVar5 = (&histomax_1)[uStack_158];
            (&histomax_1)[uStack_158] = (&histomax_1)[_histo1];
            (&histomax_1)[_histo1] = uVar5;
          }
        }
      }
      uVar6 = histo[0] + histo[1];
      local_1f0 = uVar6;
      if (uVar6 <= histomax_1) {
        local_1f0 = histomax_1;
      }
      histogram_local =
           (HistogramDistance *)
           (((double)(uVar6 * 3) + 37.0 + (double)((histomax_1 + h23) * 2)) - (double)local_1f0);
    }
    else {
      local_168 = 1;
      memset(&log2total,0,0x48);
      uVar7 = histogram->total_count_;
      if (uVar7 < 0x100) {
        local_98 = kLog2Table[uVar7];
      }
      else {
        auVar10._8_4_ = (int)(uVar7 >> 0x20);
        auVar10._0_8_ = uVar7;
        auVar10._12_4_ = 0x45300000;
        local_98 = log2((auVar10._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0));
      }
      _histo1 = 0;
      while (_histo1 < 0x220) {
        if (histogram->data_[_histo1] == 0) {
          k._4_4_ = 1;
          uVar7 = _histo1;
          while( true ) {
            local_1e0 = uVar7 + 1;
            bVar8 = false;
            if (local_1e0 < 0x220) {
              bVar8 = histogram->data_[uVar7 + 1] == 0;
            }
            if (!bVar8) break;
            k._4_4_ = k._4_4_ + 1;
            uVar7 = local_1e0;
          }
          _histo1 = k._4_4_ + _histo1;
          if (_histo1 == 0x220) break;
          if (k._4_4_ < 3) {
            log2total._0_4_ = k._4_4_ + log2total._0_4_;
          }
          else {
            for (k._4_4_ = k._4_4_ - 2; k._4_4_ != 0; k._4_4_ = k._4_4_ >> 3) {
              depth_histo[0xf] = depth_histo[0xf] + 1;
              i = (size_t)((double)i + 3.0);
            }
          }
        }
        else {
          uVar7 = CONCAT44(0,histogram->data_[_histo1]);
          if (uVar7 < 0x100) {
            local_a8 = kLog2Table[uVar7];
          }
          else {
            auVar11._8_4_ = 0;
            auVar11._0_8_ = uVar7;
            auVar11._12_4_ = 0x45300000;
            local_a8 = log2((auVar11._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,histogram->data_[_histo1]) -
                            4503599627370496.0));
          }
          dVar9 = (local_98 - local_a8) + 0.5;
          uStack_1d0 = (ulong)dVar9;
          uStack_1d0 = uStack_1d0 | (long)(dVar9 - 9.223372036854776e+18) & (long)uStack_1d0 >> 0x3f
          ;
          i = (size_t)((double)histogram->data_[_histo1] * (local_98 - local_a8) + (double)i);
          if (0xf < uStack_1d0) {
            uStack_1d0 = 0xf;
          }
          if (local_168 < uStack_1d0) {
            local_168 = uStack_1d0;
          }
          depth_histo[uStack_1d0 - 2] = depth_histo[uStack_1d0 - 2] + 1;
          _histo1 = _histo1 + 1;
        }
      }
      lVar1 = local_168 * 2 + 0x12;
      auVar12._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar12._0_8_ = lVar1;
      auVar12._12_4_ = 0x45300000;
      local_78 = &log2total;
      sum = 0x12;
      local_48 = 0x12;
      sum_1 = (size_t)&retval;
      retval_1 = 0.0;
      population_end = (uint32_t *)0x0;
      p = (size_t)(depth_histo + 0x10);
      local_40 = local_78;
      while (local_40 < p) {
        uVar6 = *(uint *)local_40;
        local_70 = CONCAT44(0,uVar6);
        retval_1 = (double)((long)retval_1 + local_70);
        auVar13._8_4_ = 0;
        auVar13._0_8_ = local_70;
        auVar13._12_4_ = 0x45300000;
        local_18 = local_70;
        if (local_70 < 0x100) {
          local_10 = kLog2Table[local_70];
          local_40 = (double *)((long)local_40 + 4);
        }
        else {
          auVar14._8_4_ = 0;
          auVar14._0_8_ = local_70;
          auVar14._12_4_ = 0x45300000;
          local_40 = (double *)((long)local_40 + 4);
          local_10 = log2((auVar14._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0));
        }
        population_end =
             (uint32_t *)
             (-((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) * local_10 +
             (double)population_end);
        uVar6 = *(uint *)local_40;
        local_70 = CONCAT44(0,uVar6);
        retval_1 = (double)((long)retval_1 + local_70);
        auVar15._8_4_ = 0;
        auVar15._0_8_ = local_70;
        auVar15._12_4_ = 0x45300000;
        local_28 = local_70;
        if (local_70 < 0x100) {
          local_20 = kLog2Table[local_70];
          local_40 = (double *)((long)local_40 + 4);
        }
        else {
          auVar16._8_4_ = 0;
          auVar16._0_8_ = local_70;
          auVar16._12_4_ = 0x45300000;
          local_40 = (double *)((long)local_40 + 4);
          local_20 = log2((auVar16._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0));
        }
        population_end =
             (uint32_t *)
             (-((auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) * local_20 +
             (double)population_end);
      }
      if (retval_1 != 0.0) {
        uVar21 = (undefined4)((ulong)retval_1 >> 0x20);
        auVar17._8_4_ = uVar21;
        auVar17._0_8_ = retval_1;
        auVar17._12_4_ = 0x45300000;
        uVar22 = SUB84(retval_1,0);
        local_38 = retval_1;
        if ((ulong)retval_1 < 0x100) {
          local_30 = kLog2Table[(long)retval_1];
        }
        else {
          auVar18._8_4_ = uVar21;
          auVar18._0_8_ = retval_1;
          auVar18._12_4_ = 0x45300000;
          local_30 = log2((auVar18._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0));
        }
        population_end =
             (uint32_t *)
             (((auVar17._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0)) * local_30 +
             (double)population_end);
      }
      *(double *)sum_1 = retval_1;
      local_90 = population_end;
      uVar22 = (undefined4)((ulong)retval >> 0x20);
      auVar19._8_4_ = uVar22;
      auVar19._0_8_ = retval;
      auVar19._12_4_ = 0x45300000;
      if ((double)population_end <
          (auVar19._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0)) {
        auVar20._8_4_ = uVar22;
        auVar20._0_8_ = retval;
        auVar20._12_4_ = 0x45300000;
        local_90 = (uint32_t *)
                   ((auVar20._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0));
      }
      histogram_local =
           (HistogramDistance *)
           ((double)local_90 +
           (auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0) + (double)i);
    }
  }
  return (double)histogram_local;
}

Assistant:

double FN(BrotliPopulationCost)(const HistogramType* histogram) {
  static const double kOneSymbolHistogramCost = 12;
  static const double kTwoSymbolHistogramCost = 20;
  static const double kThreeSymbolHistogramCost = 28;
  static const double kFourSymbolHistogramCost = 37;
  const size_t data_size = FN(HistogramDataSize)();
  int count = 0;
  size_t s[5];
  double bits = 0.0;
  size_t i;
  if (histogram->total_count_ == 0) {
    return kOneSymbolHistogramCost;
  }
  for (i = 0; i < data_size; ++i) {
    if (histogram->data_[i] > 0) {
      s[count] = i;
      ++count;
      if (count > 4) break;
    }
  }
  if (count == 1) {
    return kOneSymbolHistogramCost;
  }
  if (count == 2) {
    return (kTwoSymbolHistogramCost + (double)histogram->total_count_);
  }
  if (count == 3) {
    const uint32_t histo0 = histogram->data_[s[0]];
    const uint32_t histo1 = histogram->data_[s[1]];
    const uint32_t histo2 = histogram->data_[s[2]];
    const uint32_t histomax =
        BROTLI_MAX(uint32_t, histo0, BROTLI_MAX(uint32_t, histo1, histo2));
    return (kThreeSymbolHistogramCost +
            2 * (histo0 + histo1 + histo2) - histomax);
  }
  if (count == 4) {
    uint32_t histo[4];
    uint32_t h23;
    uint32_t histomax;
    for (i = 0; i < 4; ++i) {
      histo[i] = histogram->data_[s[i]];
    }
    /* Sort */
    for (i = 0; i < 4; ++i) {
      size_t j;
      for (j = i + 1; j < 4; ++j) {
        if (histo[j] > histo[i]) {
          BROTLI_SWAP(uint32_t, histo, j, i);
        }
      }
    }
    h23 = histo[2] + histo[3];
    histomax = BROTLI_MAX(uint32_t, h23, histo[0]);
    return (kFourSymbolHistogramCost +
            3 * h23 + 2 * (histo[0] + histo[1]) - histomax);
  }

  {
    /* In this loop we compute the entropy of the histogram and simultaneously
       build a simplified histogram of the code length codes where we use the
       zero repeat code 17, but we don't use the non-zero repeat code 16. */
    size_t max_depth = 1;
    uint32_t depth_histo[BROTLI_CODE_LENGTH_CODES] = { 0 };
    const double log2total = FastLog2(histogram->total_count_);
    for (i = 0; i < data_size;) {
      if (histogram->data_[i] > 0) {
        /* Compute -log2(P(symbol)) = -log2(count(symbol)/total_count) =
                                    = log2(total_count) - log2(count(symbol)) */
        double log2p = log2total - FastLog2(histogram->data_[i]);
        /* Approximate the bit depth by round(-log2(P(symbol))) */
        size_t depth = (size_t)(log2p + 0.5);
        bits += histogram->data_[i] * log2p;
        if (depth > 15) {
          depth = 15;
        }
        if (depth > max_depth) {
          max_depth = depth;
        }
        ++depth_histo[depth];
        ++i;
      } else {
        /* Compute the run length of zeros and add the appropriate number of 0
           and 17 code length codes to the code length code histogram. */
        uint32_t reps = 1;
        size_t k;
        for (k = i + 1; k < data_size && histogram->data_[k] == 0; ++k) {
          ++reps;
        }
        i += reps;
        if (i == data_size) {
          /* Don't add any cost for the last zero run, since these are encoded
             only implicitly. */
          break;
        }
        if (reps < 3) {
          depth_histo[0] += reps;
        } else {
          reps -= 2;
          while (reps > 0) {
            ++depth_histo[BROTLI_REPEAT_ZERO_CODE_LENGTH];
            /* Add the 3 extra bits for the 17 code length code. */
            bits += 3;
            reps >>= 3;
          }
        }
      }
    }
    /* Add the estimated encoding cost of the code length code histogram. */
    bits += (double)(18 + 2 * max_depth);
    /* Add the entropy of the code length code histogram. */
    bits += BitsEntropy(depth_histo, BROTLI_CODE_LENGTH_CODES);
  }
  return bits;
}